

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O3

void __thiscall
Logging::logValue(Logging *this,long populationID,int neuronID,int valueType,double value)

{
  iterator iVar1;
  iterator __position;
  iterator iVar2;
  int local_48;
  int local_44;
  double local_40;
  double local_38;
  double local_30;
  long local_28;
  
  local_48 = valueType;
  local_44 = neuronID;
  local_40 = value;
  local_30 = value;
  local_28 = populationID;
  local_38 = Clock::getCurrentTime(this->clock);
  iVar1._M_current =
       (this->value_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->value_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->value_time,iVar1,&local_38);
  }
  else {
    *iVar1._M_current = local_38;
    (this->value_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  __position._M_current =
       (this->value_populationID).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->value_populationID).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
              ((vector<long,std::allocator<long>> *)&this->value_populationID,__position,&local_28);
  }
  else {
    *__position._M_current = populationID;
    (this->value_populationID).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  iVar2._M_current =
       (this->value_neuronID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->value_neuronID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->value_neuronID,iVar2,&local_44);
  }
  else {
    *iVar2._M_current = neuronID;
    (this->value_neuronID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->value_valueType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->value_valueType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->value_valueType,iVar2,&local_48);
  }
  else {
    *iVar2._M_current = valueType;
    (this->value_valueType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar1._M_current =
       (this->value_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->value_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->value_value,iVar1,&local_30);
  }
  else {
    *iVar1._M_current = local_40;
    (this->value_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void Logging::logValue(long populationID, int neuronID, int valueType, double value) {
    value_time.push_back(clock->getCurrentTime());
    value_populationID.push_back(populationID);
    value_neuronID.push_back(neuronID);
    value_valueType.push_back(valueType);
    value_value.push_back(value);
}